

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void flush_before_commit_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle **ppfVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  long lVar11;
  fdb_config *pfVar12;
  fdb_doc **ppfVar13;
  fdb_doc *pfVar14;
  char *ptr_handle;
  fdb_encryption_key *pfVar15;
  fdb_doc *pfVar16;
  char *pcVar17;
  ulong uVar18;
  fdb_file_handle **ptr_fhandle;
  fdb_doc **doc_00;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle **ppfVar20;
  char *handle;
  bool bVar21;
  fdb_file_handle *dbfile_txn;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn;
  fdb_kvs_handle *db;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  fdb_kvs_handle *pfStack_1c540;
  fdb_file_handle *pfStack_1c538;
  void *pvStack_1c530;
  size_t asStack_1c528 [3];
  undefined4 uStack_1c510;
  undefined4 uStack_1c50c;
  undefined4 uStack_1c508;
  undefined4 uStack_1c504;
  undefined4 uStack_1c500;
  fdb_kvs_config fStack_1c4f8;
  timeval tStack_1c4e0;
  fdb_config fStack_1c4d0;
  char acStack_1c3d8 [256];
  char acStack_1c2d8 [256];
  char acStack_1c1d8 [264];
  fdb_config *pfStack_1c0d0;
  fdb_kvs_handle **ppfStack_1c0c8;
  fdb_kvs_handle *pfStack_1c0c0;
  fdb_kvs_handle **ppfStack_1c0b8;
  fdb_kvs_handle *pfStack_1c0b0;
  code *pcStack_1c0a8;
  fdb_kvs_handle *pfStack_1c090;
  fdb_file_handle *pfStack_1c088;
  fdb_kvs_handle *pfStack_1c080;
  fdb_kvs_handle *pfStack_1c078;
  fdb_kvs_config fStack_1c070;
  timeval tStack_1c058;
  fdb_config fStack_1c048;
  fdb_kvs_handle *apfStack_1bf50 [32];
  fdb_config fStack_1be50;
  fdb_kvs_handle **ppfStack_1bd48;
  fdb_kvs_handle **ppfStack_1bd40;
  fdb_kvs_handle **ppfStack_1bd38;
  fdb_kvs_handle *pfStack_1bd30;
  fdb_kvs_handle *pfStack_1bd20;
  fdb_kvs_handle *pfStack_1bd18;
  fdb_kvs_handle **ppfStack_1bd10;
  fdb_kvs_handle *pfStack_1bd08;
  fdb_kvs_config fStack_1bd00;
  undefined1 auStack_1bce8 [128];
  fdb_kvs_handle *apfStack_1bc68 [33];
  fdb_config fStack_1bb60;
  fdb_kvs_handle *apfStack_1ba68 [32];
  fdb_kvs_handle *apfStack_1b968 [32];
  fdb_kvs_handle fStack_1b868;
  undefined8 auStack_1b468 [896];
  fdb_kvs_handle *apfStack_19868 [1025];
  fdb_doc **ppfStack_17860;
  char *pcStack_17858;
  long lStack_17850;
  fdb_doc *pfStack_17848;
  fdb_doc **ppfStack_17840;
  fdb_doc *pfStack_17838;
  fdb_doc *pfStack_17820;
  fdb_file_handle *pfStack_17818;
  long lStack_17810;
  fdb_kvs_handle *pfStack_17808;
  long lStack_17800;
  long lStack_177f8;
  fdb_doc **ppfStack_177f0;
  long lStack_177e8;
  fdb_doc **ppfStack_177e0;
  size_t sStack_177d8;
  timeval tStack_177d0;
  fdb_kvs_config fStack_177c0;
  fdb_file_info fStack_177a8;
  fdb_doc afStack_17760 [3];
  char acStack_17660 [264];
  fdb_config fStack_17558;
  char acStack_17460 [256];
  fdb_doc *apfStack_17360 [2999];
  size_t sStack_115a8;
  size_t asStack_115a0 [1023];
  undefined1 auStack_f5a1 [57225];
  fdb_doc **ppfStack_1618;
  fdb_config *pfStack_1610;
  fdb_file_handle **ppfStack_1608;
  ulong uStack_1600;
  fdb_kvs_handle **ppfStack_15f8;
  fdb_kvs_handle **ppfStack_15f0;
  fdb_doc *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  undefined1 auStack_15c8 [24];
  fdb_file_handle *pfStack_15b0;
  fdb_kvs_handle *pfStack_15a8;
  fdb_kvs_config fStack_15a0;
  fdb_doc *apfStack_1588 [31];
  timeval tStack_1490;
  fdb_config fStack_1480;
  char acStack_1388 [256];
  fdb_file_handle *apfStack_1288 [32];
  char acStack_1188 [264];
  fdb_kvs_handle **ppfStack_1080;
  char *pcStack_1078;
  char *pcStack_1070;
  ulong uStack_1068;
  undefined8 uStack_1060;
  code *pcStack_1058;
  fdb_file_handle *pfStack_1050;
  fdb_kvs_handle *pfStack_1048;
  char acStack_1040 [32];
  fdb_kvs_config fStack_1020;
  timeval tStack_1008;
  fdb_file_info afStack_ff8 [3];
  fdb_config fStack_f00;
  fdb_config *pfStack_e08;
  fdb_kvs_handle **ppfStack_e00;
  fdb_kvs_handle *pfStack_df8;
  fdb_doc *pfStack_df0;
  fdb_kvs_handle *pfStack_de8;
  fdb_encryption_key *pfStack_de0;
  fdb_kvs_handle *pfStack_dd0;
  fdb_file_handle *pfStack_dc8;
  undefined1 auStack_dc0 [8];
  undefined1 auStack_db8 [48];
  fdb_kvs_handle *apfStack_d88 [32];
  fdb_doc afStack_c88 [3];
  fdb_config fStack_b88;
  ulong uStack_a90;
  fdb_kvs_handle **ppfStack_a88;
  fdb_kvs_handle *pfStack_a80;
  fdb_doc *pfStack_a78;
  fdb_kvs_handle *pfStack_a70;
  fdb_encryption_key *pfStack_a68;
  fdb_doc *pfStack_a58;
  fdb_kvs_handle *pfStack_a50;
  fdb_kvs_handle *pfStack_a48;
  fdb_file_handle *pfStack_a40;
  fdb_file_handle *pfStack_a38;
  fdb_doc *apfStack_a30 [11];
  fdb_kvs_config fStack_9d8;
  timeval tStack_9c0;
  fdb_kvs_handle fStack_9b0;
  fdb_config fStack_6b0;
  fdb_kvs_config *pfStack_5b8;
  fdb_file_handle **ppfStack_5b0;
  fdb_file_handle **ppfStack_5a8;
  fdb_kvs_handle **ppfStack_5a0;
  char *pcStack_598;
  fdb_file_handle *local_578;
  fdb_file_handle *local_570;
  fdb_kvs_handle *local_568;
  fdb_kvs_handle *local_560;
  timeval local_558;
  fdb_doc *local_548 [31];
  fdb_kvs_config local_450;
  char local_438 [264];
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_558,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_330.buffercache_size = 0;
  local_330.wal_threshold = 5;
  local_330.flags = 1;
  local_330.purging_interval = 0;
  local_330.compaction_threshold = '\0';
  local_330.wal_flush_before_commit = true;
  fdb_open(&local_570,"dummy1",&local_330);
  fdb_open(&local_578,"dummy1",&local_330);
  fdb_kvs_open_default(local_570,&local_560,&local_450);
  fdb_kvs_open_default(local_578,&local_568,&local_450);
  fVar3 = fdb_set_log_callback(local_568,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar13 = local_548;
    uVar18 = 0;
    do {
      sprintf(local_438,"key%d",uVar18 & 0xffffffff);
      sprintf(local_138,"meta%d",uVar18 & 0xffffffff);
      sprintf(local_238,"body%d",uVar18 & 0xffffffff);
      sVar5 = strlen(local_438);
      sVar6 = strlen(local_138);
      sVar7 = strlen(local_238);
      fdb_doc_create(ppfVar13,local_438,sVar5,local_138,sVar6,local_238,sVar7);
      uVar18 = uVar18 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar18 != 0x1e);
    fdb_begin_transaction(local_578,'\x02');
    lVar11 = 0;
    do {
      fdb_set(local_560,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_commit(local_570,'\0');
    do {
      fdb_set(local_568,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_end_transaction(local_578,'\0');
    fdb_commit(local_570,'\x01');
    fdb_begin_transaction(local_578,'\x02');
    do {
      fdb_set(local_568,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_end_transaction(local_578,'\0');
    do {
      fdb_set(local_560,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_commit(local_570,'\0');
    fdb_commit(local_570,'\x01');
    fdb_begin_transaction(local_578,'\x02');
    do {
      fdb_set(local_568,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    do {
      fdb_set(local_560,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_commit(local_570,'\0');
    fdb_end_transaction(local_578,'\0');
    fdb_commit(local_570,'\x01');
    fdb_begin_transaction(local_578,'\x02');
    do {
      fdb_set(local_560,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    do {
      fdb_set(local_568,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    fdb_end_transaction(local_578,'\0');
    fdb_commit(local_570,'\0');
    fdb_commit(local_570,'\x01');
    fdb_begin_transaction(local_578,'\x02');
    do {
      fdb_set(local_568,local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 10);
    lVar11 = 0;
    do {
      fdb_set(local_560,local_548[lVar11 + 10]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 10);
    fdb_compact(local_570,"dummy2");
    lVar11 = 0;
    do {
      fdb_set(local_568,local_548[lVar11 + 0x14]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 5);
    lVar11 = 0;
    fdb_end_transaction(local_578,'\0');
    do {
      fdb_set(local_560,local_548[lVar11 + 0x19]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 5);
    fdb_close(local_570);
    fdb_close(local_578);
    lVar11 = 0;
    do {
      fdb_doc_free(local_548[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x1e);
    fdb_shutdown();
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar17,"flush before commit test");
    return;
  }
  flush_before_commit_test();
  pcStack_598 = "dummy1";
  pfStack_a68 = (fdb_encryption_key *)0x11777e;
  pfStack_5b8 = &local_450;
  ppfStack_5b0 = &local_570;
  ppfStack_5a8 = &local_578;
  ppfStack_5a0 = &local_568;
  gettimeofday(&tStack_9c0,(__timezone_ptr_t)0x0);
  pfStack_a68 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_a58 = (fdb_doc *)0x0;
  pfStack_a68 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_a68 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_6b0.buffercache_size = 0;
  fStack_6b0.wal_threshold = 8;
  fStack_6b0.flags = 1;
  fStack_6b0.purging_interval = 0;
  fStack_6b0.compaction_threshold = '\0';
  fStack_6b0.wal_flush_before_commit = true;
  pfStack_a68 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_a68 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_a40,"dummy1",&fStack_6b0);
  pfStack_a68 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_a40,&pfStack_a50,(char *)0x0,&fStack_9d8);
  lVar11 = 0;
  uVar18 = 0;
  do {
    ppfVar8 = &fStack_9b0.bub_ctx.handle;
    pfStack_a68 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar8,"key%d",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_9b0.config.encryption_key,"meta%d",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_9b0,"body%d",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x11785f;
    sVar5 = strlen((char *)ppfVar8);
    pfVar15 = &fStack_9b0.config.encryption_key;
    pfStack_a68 = (fdb_encryption_key *)0x117872;
    sVar6 = strlen((char *)pfVar15);
    pfStack_a68 = (fdb_encryption_key *)0x117882;
    sVar7 = strlen((char *)&fStack_9b0);
    pfStack_a68 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_a30 + lVar11),&fStack_9b0.bub_ctx.handle,sVar5,
                   pfVar15,sVar6,&fStack_9b0,sVar7);
    pfStack_a68 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_a50,apfStack_a30[uVar18]);
    uVar18 = uVar18 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar18 != 10);
  pfStack_a68 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_a40,'\x01');
  pfStack_a68 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_a38,"dummy1",&fStack_6b0);
  pfStack_a68 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_a38,&pfStack_a48,(char *)0x0,&fStack_9d8);
  pfVar15 = &fStack_9b0.config.encryption_key;
  lVar11 = 0;
  uVar18 = 0;
  do {
    pfStack_a68 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar15,"meta2%d",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_9b0,"body2%d(db2)",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x117956;
    sVar5 = strlen((char *)pfVar15);
    pfStack_a68 = (fdb_encryption_key *)0x117961;
    sVar6 = strlen((char *)&fStack_9b0);
    pfStack_a68 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_a30 + lVar11),pfVar15,sVar5,&fStack_9b0,sVar6);
    pfStack_a68 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_a48,apfStack_a30[uVar18]);
    uVar18 = uVar18 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar18 != 5);
  uVar18 = 5;
  lVar11 = 0x28;
  pfVar15 = &fStack_9b0.config.encryption_key;
  pfVar9 = &fStack_9b0;
  do {
    pfStack_a68 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar15,"meta2%d",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar9,"body2%d(db1)",uVar18 & 0xffffffff);
    pfStack_a68 = (fdb_encryption_key *)0x1179e5;
    sVar5 = strlen((char *)pfVar15);
    pfStack_a68 = (fdb_encryption_key *)0x1179f0;
    sVar6 = strlen((char *)pfVar9);
    pfStack_a68 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_a30 + lVar11),pfVar15,sVar5,pfVar9,sVar6);
    pfStack_a68 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_a50,apfStack_a30[uVar18]);
    uVar18 = uVar18 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar18 != 10);
  ppfVar8 = &fStack_9b0.bub_ctx.handle;
  pfVar15 = &fStack_9b0.config.encryption_key;
  uVar18 = 0;
  do {
    pcVar17 = "body2%d(db1)";
    pfStack_a68 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar8,"key%d",uVar18);
    pfStack_a68 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar15,"meta2%d",uVar18);
    if ((uint)uVar18 < 5) {
      pcVar17 = "body2%d(db2)";
    }
    pfStack_a68 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_9b0,pcVar17,uVar18);
    pfStack_a68 = (fdb_encryption_key *)0x117a8c;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_a68 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_a58,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_a68 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(pfStack_a50,pfStack_a58);
    pfVar16 = pfStack_a58;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_a68 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_a68 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar16 = (fdb_doc *)pcVar17;
LAB_00117dd3:
      pfStack_a68 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_a68 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_a68 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar9 = (fdb_kvs_handle *)pfStack_a58->meta;
    pfStack_a68 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_a58->metalen);
    if (iVar4 != 0) {
      pfStack_a68 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar17 = (char *)pfVar16;
      goto LAB_00117dc9;
    }
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_a68 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&fStack_9b0,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_a68 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar16);
    pcVar17 = (char *)0x0;
    pfStack_a58 = (fdb_doc *)0x0;
    pfStack_a68 = (fdb_encryption_key *)0x117b16;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_a68 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_a58,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_a68 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(pfStack_a48,pfStack_a58);
    pfVar16 = pfStack_a58;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar9 = (fdb_kvs_handle *)pfStack_a58->meta;
    pfStack_a68 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_a58->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_a68 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&fStack_9b0,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_a68 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar16);
    pfStack_a58 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar18 + 1;
    uVar18 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_a68 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_a40,'\0');
  pfStack_a68 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_a38,'\0');
  ppfVar8 = &fStack_9b0.bub_ctx.handle;
  pfVar15 = &fStack_9b0.config.encryption_key;
  uVar18 = 0;
  while( true ) {
    pfStack_a68 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar8,"key%d",uVar18);
    pfStack_a68 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar15,"meta2%d",uVar18);
    pcVar17 = "body2%d(db1)";
    if ((uint)uVar18 < 5) {
      pcVar17 = "body2%d(db2)";
    }
    pfStack_a68 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_9b0,pcVar17,uVar18);
    pfStack_a68 = (fdb_encryption_key *)0x117c28;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_a68 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_a58,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_a68 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(pfStack_a50,pfStack_a58);
    pfVar16 = pfStack_a58;
    pfVar14 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar9 = (fdb_kvs_handle *)pfStack_a58->meta;
    pfStack_a68 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_a58->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_a68 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&fStack_9b0,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_a68 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar16);
    pfVar14 = (fdb_doc *)0x0;
    pfStack_a58 = (fdb_doc *)0x0;
    pfStack_a68 = (fdb_encryption_key *)0x117cb2;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_a68 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_a58,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_a68 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(pfStack_a48,pfStack_a58);
    pfVar16 = pfStack_a58;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar9 = (fdb_kvs_handle *)pfStack_a58->meta;
    pfStack_a68 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_a58->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_a68 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&fStack_9b0,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_a68 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar16);
    pfStack_a58 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar18 + 1;
    uVar18 = (ulong)uVar10;
    if (uVar10 == 10) {
      pfStack_a68 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_a40);
      pfStack_a68 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_a38);
      lVar11 = 0;
      do {
        pfStack_a68 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_a30[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 10);
      pfStack_a68 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_a68 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_a68 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar17,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_a68 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_a68 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar16 = pfVar14;
LAB_00117e1d:
  pfStack_a68 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_a68 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar19 = &fStack_9b0;
  ppfVar8 = &fStack_9b0.bub_ctx.handle;
  pfVar15 = &fStack_9b0.config.encryption_key;
  pfStack_a68 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_de0 = (fdb_encryption_key *)0x117e6a;
  uStack_a90 = uVar18;
  ppfStack_a88 = ppfVar8;
  pfStack_a80 = pfVar9;
  pfStack_a78 = pfVar16;
  pfStack_a70 = pfVar19;
  pfStack_a68 = pfVar15;
  gettimeofday((timeval *)(auStack_db8 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_de0 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_de0 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_b88;
  pfStack_de0 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_de0 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_b88.buffercache_size = 0;
  fStack_b88.wal_threshold = 0x1000;
  fStack_b88.flags = 1;
  fStack_b88.durability_opt = '\x02';
  fStack_b88.auto_commit = true;
  pfStack_de0 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_dc8,"dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_de0 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_dc8,&pfStack_dd0,(fdb_kvs_config *)(auStack_db8 + 8));
    pcVar17 = (char *)pfVar19;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar17 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_de0 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_c88,"key%d",pfVar15);
      pfStack_de0 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_d88,"body%d",pfVar15);
      pfVar9 = pfStack_dd0;
      pfStack_de0 = (fdb_encryption_key *)0x117f31;
      sVar5 = strlen((char *)afStack_c88);
      pfVar12 = (fdb_config *)(sVar5 + 1);
      pfStack_de0 = (fdb_encryption_key *)0x117f3d;
      sVar5 = strlen((char *)apfStack_d88);
      pfStack_de0 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar9,afStack_c88,(size_t)pfVar12,apfStack_d88,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_de0 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar10 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfVar16 = afStack_c88;
    ppfVar8 = apfStack_d88;
    pfVar9 = (fdb_kvs_handle *)auStack_db8;
    pfVar15 = (fdb_encryption_key *)auStack_dc0;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_de0 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_de0 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_dd0;
      pfStack_de0 = (fdb_encryption_key *)0x117fb0;
      sVar5 = strlen((char *)pfVar16);
      pfStack_de0 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar17 = (char *)auStack_db8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_de0 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_db8._0_8_,ppfVar8,(size_t)auStack_dc0);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_de0 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar17);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_de0 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_dd0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_de0 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_dc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_de0 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_dc8,"dummy1",&fStack_b88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_de0 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_dc8,&pfStack_dd0,(fdb_kvs_config *)(auStack_db8 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar16 = afStack_c88;
    ppfVar8 = apfStack_d88;
    pfVar9 = (fdb_kvs_handle *)auStack_db8;
    pfVar15 = (fdb_encryption_key *)auStack_dc0;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_de0 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_de0 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_dd0;
      pfStack_de0 = (fdb_encryption_key *)0x1180a9;
      sVar5 = strlen((char *)pfVar16);
      pfStack_de0 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar17 = (char *)auStack_db8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_de0 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_db8._0_8_,ppfVar8,(size_t)auStack_dc0);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_de0 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar17);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_de0 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_dc8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_de0 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_de0 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_de0 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar17,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_de0 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar17 = (char *)pfVar19;
LAB_00118182:
    pfStack_de0 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_de0 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_de0 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_de0 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_de0 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_de0 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_1058 = (code *)0x1181bd;
  pfStack_e08 = pfVar12;
  ppfStack_e00 = ppfVar8;
  pfStack_df8 = pfVar9;
  pfStack_df0 = pfVar16;
  pfStack_de8 = (fdb_kvs_handle *)pcVar17;
  pfStack_de0 = pfVar15;
  gettimeofday(&tStack_1008,(__timezone_ptr_t)0x0);
  pcStack_1058 = (code *)0x1181c2;
  memleak_start();
  pcStack_1058 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_1058 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_f00.buffercache_size = 0;
  fStack_f00.auto_commit = true;
  pcStack_1058 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_1058 = (code *)0x118207;
  memcpy(&fStack_f00,afStack_ff8,0xf8);
  pcStack_1058 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar18 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_1040 + 8,"est1",5);
    builtin_strncpy(acStack_1040,"./func_t",8);
    pcStack_1058 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_1050,acStack_1040,&fStack_f00);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_1058 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_1050,&pfStack_1048,"justonekv",&fStack_1020);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_1058 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_1058 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_1050,afStack_ff8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_ff8[0].file_size != fStack_f00.blocksize * 7) {
      pcStack_1058 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_1058 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_1050);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar10 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar10;
    if (uVar10 == 0) {
      pcStack_1058 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_1058 = (code *)0x1182e9;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_1058 = (code *)0x11831a;
      fprintf(_stderr,pcVar17,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_1058 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_1058 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_1058 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_1060 = 0x745f636e75662f2e;
  pcStack_1070 = "justonekv";
  ppfStack_15f0 = (fdb_kvs_handle **)0x118363;
  ppfStack_1080 = &pfStack_1048;
  pcStack_1078 = acStack_1040;
  uStack_1068 = uVar18;
  pcStack_1058 = (code *)&pfStack_1050;
  gettimeofday(&tStack_1490,(__timezone_ptr_t)0x0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_15d8 = (fdb_doc *)0x0;
  ppfStack_15f0 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_15f0 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_15f0 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_1480.buffercache_size = 0;
  fStack_1480.flags = 1;
  fStack_1480.purging_interval = 0;
  fStack_1480.compaction_threshold = '\0';
  ppfStack_15f0 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_15c8 + 0x10),"dummy1",&fStack_1480);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_15c8,"dummy1",&fStack_1480);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._16_8_,&pfStack_15d0,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_15c8._0_8_,(fdb_kvs_handle **)(auStack_15c8 + 8),
             &fStack_15a0);
  ppfVar13 = apfStack_1588;
  uVar18 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_1388,"key%d",uVar18 & 0xffffffff);
    ppfStack_15f0 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_1188,"meta%d",uVar18 & 0xffffffff);
    ptr_fhandle = apfStack_1288;
    ppfStack_15f0 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar18 & 0xffffffff);
    ppfStack_15f0 = (fdb_kvs_handle **)0x118462;
    ppfVar8 = (fdb_kvs_handle **)strlen(acStack_1388);
    ppfStack_15f0 = (fdb_kvs_handle **)0x11846d;
    sVar5 = strlen(acStack_1188);
    ppfStack_15f0 = (fdb_kvs_handle **)0x118478;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_15f0 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar13,acStack_1388,(size_t)ppfVar8,acStack_1188,sVar5,ptr_fhandle,sVar6);
    uVar18 = uVar18 + 1;
    ppfVar13 = ppfVar13 + 1;
  } while (uVar18 != 0x1e);
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_15d0,apfStack_1588[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_15c8._16_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_15c8._16_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_15c8._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar12 = &fStack_1480;
  ppfStack_15f0 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_15c8 + 0x10),"dummy1",pfVar12);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_15c8,"dummy1",pfVar12);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._16_8_,&pfStack_15d0,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_15c8._0_8_,(fdb_kvs_handle **)(auStack_15c8 + 8),
             &fStack_15a0);
  uVar18 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_15d8,apfStack_1588[uVar18]->key,apfStack_1588[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_15f0 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_15d0,pfStack_15d8);
    if (uVar18 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_15f0 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_15d8);
    pfStack_15d8 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[lVar11 + 2]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_15d0,apfStack_1588[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_15c8._16_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_15c8._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar12 = &fStack_1480;
  ppfStack_15f0 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_15c8 + 0x10),"dummy1",pfVar12);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_15c8,"dummy1",pfVar12);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._16_8_,&pfStack_15d0,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_15c8._0_8_,(fdb_kvs_handle **)(auStack_15c8 + 8),
             &fStack_15a0);
  uVar18 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_15d8,apfStack_1588[uVar18]->key,apfStack_1588[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_15f0 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_15d0,pfStack_15d8);
    if ((uVar18 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_15f0 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_15f0 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_15d8);
    pfStack_15d8 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 6);
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_15d0,apfStack_1588[lVar11 + 4]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x02');
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[lVar11 + 6]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_15c8._16_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_15b0,"dummy1",&fStack_1480);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_15b0,&pfStack_15a8,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_15b0,'\x02');
  lVar11 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_15a8,apfStack_1588[lVar11 + 8]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_15b0,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_15c8._16_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_15c8._0_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_15b0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_15c8 + 0x10),"dummy1",&fStack_1480);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._16_8_,&pfStack_15d0,&fStack_15a0);
  uVar18 = 0;
  do {
    ppfStack_15f0 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_15d8,apfStack_1588[uVar18]->key,apfStack_1588[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_15f0 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_15d0,pfStack_15d8);
    if ((int)uVar18 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_15f0 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_15d8);
    pfStack_15d8 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 10);
  pfVar12 = (fdb_config *)auStack_15c8;
  ppfStack_15f0 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar12,"dummy1",&fStack_1480);
  ptr_fhandle = &pfStack_15b0;
  ppfStack_15f0 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_1480);
  ppfVar20 = (fdb_kvs_handle **)(auStack_15c8 + 8);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._0_8_,ppfVar20,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_15b0,&pfStack_15a8,&fStack_15a0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x02');
  ppfVar8 = &pfStack_15d0;
  ppfStack_15f0 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_15d0,apfStack_1588[10]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_15c8._16_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_15d0,apfStack_1588[0xb]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[0xc]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_15c8._16_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[0xd]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_15b0,'\x02');
  ppfStack_15f0 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_15a8,apfStack_1588[0xe]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_15a8,apfStack_1588[0xf]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_15d0,apfStack_1588[0x10]);
  ppfStack_15f0 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_15b0,'\x01');
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_15d0,apfStack_1588[0x11]);
  uVar18 = 0;
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_15c8._16_8_,'\0');
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_15c8._16_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_15c8._0_8_);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_15b0);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_15c8 + 0x10),"dummy1",&fStack_1480);
  ppfStack_15f0 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_15c8._16_8_,ppfVar8,&fStack_15a0);
  while( true ) {
    ppfStack_15f0 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_15d8,apfStack_1588[uVar18 + 10]->key,apfStack_1588[uVar18 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_15f0 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_15d0,pfStack_15d8);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_15f0 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_15d8);
    pfStack_15d8 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
    if (uVar18 == 8) {
      ppfStack_15f0 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_15c8,"dummy1",&fStack_1480);
      ppfStack_15f0 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_15c8._0_8_,(fdb_kvs_handle **)(auStack_15c8 + 8),
                 &fStack_15a0);
      ppfStack_15f0 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x02');
      ppfStack_15f0 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_15c8._8_8_,apfStack_1588[0x14]);
      ppfStack_15f0 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_15c8._16_8_,"dummy2");
      ppfStack_15f0 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_15c8._0_8_,'\x01');
      ppfStack_15f0 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_15c8._16_8_);
      ppfStack_15f0 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_15c8._0_8_);
      lVar11 = 0;
      do {
        ppfStack_15f0 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_1588[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1e);
      ppfStack_15f0 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_15f0 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_15f0 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar17,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_15f0 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_15f0 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_15f0 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_15f0 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_15f0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_17838 = (fdb_doc *)0x118b77;
  ppfStack_1618 = &pfStack_15d8;
  pfStack_1610 = pfVar12;
  ppfStack_1608 = ptr_fhandle;
  uStack_1600 = uVar18;
  ppfStack_15f8 = ppfVar20;
  ppfStack_15f0 = ppfVar8;
  gettimeofday(&tStack_177d0,(__timezone_ptr_t)0x0);
  pfStack_17838 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_17820 = (fdb_doc *)0x0;
  pfStack_17838 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_17838 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_17838 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_17558.flags = 1;
  fStack_17558.purging_interval = 0;
  fStack_17558.compaction_threshold = '\0';
  fStack_17558.durability_opt = '\x02';
  pfStack_17838 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_17818,"dummy1",&fStack_17558);
  pfStack_17838 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_17818,&pfStack_17808,&fStack_177c0);
  ppfVar13 = apfStack_17360;
  pfVar16 = afStack_17760;
  pfVar14 = (fdb_doc *)0x0;
  lVar11 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar11 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar11 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_17838 = (fdb_doc *)0x118c39;
    lStack_17800 = lVar11;
    memset(asStack_115a0,0x5f,sVar5);
    *(undefined1 *)((long)asStack_115a0 + sVar5) = 0;
    lVar11 = 0;
    doc_00 = ppfVar13;
    lStack_177f8 = (long)pfVar14;
    ppfStack_177f0 = ppfVar13;
    sStack_177d8 = sVar5;
    do {
      pfStack_17838 = (fdb_doc *)0x118c6f;
      lStack_177e8 = lVar11;
      sprintf((char *)pfVar16,"%08d");
      asStack_115a0[0] = afStack_17760[0].keylen;
      uVar18 = 0;
      lStack_17810 = (long)pfVar14;
      ppfStack_177e0 = doc_00;
      do {
        pfStack_17838 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar16,"%08d",uVar18 & 0xffffffff);
        *(size_t *)((long)apfStack_17360 + sStack_177d8 + 0x5db8) = afStack_17760[0].keylen;
        uVar10 = (int)lStack_17810 + (int)uVar18;
        pfStack_17838 = (fdb_doc *)0x118ce4;
        sprintf(acStack_17460,"meta%d",(ulong)uVar10);
        pfStack_17838 = (fdb_doc *)0x118cf7;
        sprintf(acStack_17660,"body%d",(ulong)uVar10);
        pfStack_17838 = (fdb_doc *)0x118d04;
        sVar5 = strlen((char *)asStack_115a0);
        pfStack_17838 = (fdb_doc *)0x118d10;
        sVar6 = strlen(acStack_17460);
        pfStack_17838 = (fdb_doc *)0x118d24;
        sVar7 = strlen(acStack_17660);
        lVar1 = lStack_17810;
        pcVar17 = acStack_17660;
        pfStack_17838 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_115a0,sVar5 + 1,acStack_17460,sVar6 + 1,pcVar17,sVar7 + 1);
        uVar18 = uVar18 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar18 != 10);
      lVar11 = lStack_177e8 + 1;
      doc_00 = ppfStack_177e0 + 10;
      pfVar14 = (fdb_doc *)(lVar1 + 10);
    } while (lVar11 != 100);
    lVar11 = lStack_17800 + 1;
    ppfVar13 = ppfStack_177f0 + 1000;
    pfVar14 = (fdb_doc *)(lStack_177f8 + 1000);
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pfStack_17838 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_17808,apfStack_17360[lVar11]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3000);
  pfStack_17838 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_17818,'\x01');
  pfStack_17838 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_17818,&fStack_177a8);
  if (fStack_177a8.doc_count != 3000) {
    pfStack_17838 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar11 = 0;
  while( true ) {
    pfStack_17838 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_17820,apfStack_17360[lVar11]->key,apfStack_17360[lVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_17838 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_17808,pfStack_17820);
    doc = pfStack_17820;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_17820->key;
    pfVar16 = apfStack_17360[lVar11];
    pcVar17 = (char *)pfVar16->key;
    pfStack_17838 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar17,pfStack_17820->keylen);
    pfVar14 = doc;
    if (iVar4 != 0) {
      pfStack_17838 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar17 = (char *)pfVar16->meta;
    pfStack_17838 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar17,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar17 = (char *)pfVar16->body;
    pfStack_17838 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar17,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_17838 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_17820 = (fdb_doc *)0x0;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3000) {
      pfStack_17838 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_17818);
      lVar11 = 0;
      do {
        pfStack_17838 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_17360[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3000);
      pfStack_17838 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_17838 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_17838 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar17,"long key test");
      return;
    }
  }
  pfStack_17838 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_17838 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_17838 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1bd30 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_17860 = &pfStack_17820;
  pcStack_17858 = pcVar17;
  lStack_17850 = lVar11;
  pfStack_17848 = pfVar14;
  ppfStack_17840 = doc_00;
  pfStack_17838 = pfVar16;
  gettimeofday((timeval *)(auStack_1bce8 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1bd30 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1bd30 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1bd30 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1bd30 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1bb60.wal_threshold = 0x400;
  fStack_1bb60.compaction_mode = '\0';
  fStack_1bb60.durability_opt = '\x02';
  handle = (char *)&fStack_1b868;
  ppfVar20 = apfStack_1ba68;
  pcVar17 = "kvs%d";
  uVar18 = 0;
  ppfVar8 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar20,"dummy%d",(ulong)ppfVar8 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1bc68 + (long)ppfVar8 + -10);
    pfStack_1bd30 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar20,&fStack_1bb60);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1bd10 = ppfVar8;
    pfStack_1bd08 = (fdb_kvs_handle *)handle;
    do {
      ppfVar8 = ppfVar2;
      pfStack_1bd30 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar20,"kvs%d",(ulong)(uint)((int)ppfVar8 + (int)uVar18));
      pfStack_1bd30 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)ppfVar20,&fStack_1bd00);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1bd30 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar8 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar8 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar8 = (fdb_kvs_handle **)((long)ppfStack_1bd10 + 1);
    uVar18 = uVar18 + 0x80;
    handle = (char *)&pfStack_1bd08[1].bub_ctx.space_used;
  } while (ppfVar8 != (fdb_kvs_handle **)0x8);
  ppfVar8 = apfStack_1bc68;
  ppfVar20 = apfStack_1b968;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar18 = 0;
    do {
      pfStack_1bd30 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar8,"key%08d",uVar18);
      pfStack_1bd30 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar20,"value%08d",uVar18);
      pcVar17 = *(char **)(&fStack_1b868.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1bd30 = (fdb_kvs_handle *)0x1190e0;
      sVar5 = strlen((char *)ppfVar8);
      ptr_handle = (char *)(sVar5 + 1);
      pfStack_1bd30 = (fdb_kvs_handle *)0x1190ec;
      sVar5 = strlen((char *)ppfVar20);
      pfStack_1bd30 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar17,ppfVar8,(size_t)ptr_handle,ppfVar20,sVar5 + 1);
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar10 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar10;
    } while (uVar10 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1bd30 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1bc68[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1bd30 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1bc68[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar20 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_19868;
  ppfVar8 = (fdb_kvs_handle **)(auStack_1bce8 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1bce8;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1b468[(long)ppfVar20],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1bce8._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1bd30 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1bd30 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1b468[(long)ppfVar20],
                              (fdb_kvs_handle **)ptr_handle,auStack_1bce8._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar20 = ppfVar20 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar20 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1bc68[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1bd18;
  pfStack_1bd18 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1bd20;
  handle = "key%08d";
  ppfVar20 = apfStack_1bc68;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_19868[(long)pfVar9],(fdb_iterator **)ppfVar8,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar18 = 0;
    do {
      pfStack_1bd30 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1bd20,(fdb_doc **)ptr_handle);
      pcVar17 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1bd30 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar20,"key%08d",uVar18);
      pfStack_1bd30 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar20,(char *)pfStack_1bd18->op_stats);
      if (iVar4 != 0) {
        pfStack_1bd30 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pfStack_1bd30 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1bd20);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1bd30 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1bd20);
    pcVar17 = (char *)&(pfVar9->config).wal_threshold;
    bVar21 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar17;
  } while (bVar21);
  pfStack_1bd30 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1bd18);
  ptr_handle = "key%08d";
  ppfVar8 = apfStack_1bc68;
  ppfVar20 = (fdb_kvs_handle **)0x0;
  do {
    uVar18 = 0;
    do {
      pfStack_1bd30 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar8,"key%08d",uVar18);
      handle = *(char **)(&fStack_1b868.kvs_config.create_if_missing + (long)ppfVar20 * 8);
      pfStack_1bd30 = (fdb_kvs_handle *)0x1192dd;
      sVar5 = strlen((char *)ppfVar8);
      pfStack_1bd30 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ppfVar8,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar10 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar10;
    } while (uVar10 != 10);
    ppfVar20 = (fdb_kvs_handle **)((long)ppfVar20 + 1);
  } while (ppfVar20 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar8 = apfStack_1ba68;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar8,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1bd30 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1bc68[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1bd18;
  pfStack_1bd18 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1bd20;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1bd30 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1b868.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ppfVar8,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1bd30 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1bd20,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1bd30 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1bd20);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1bd30 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1bd20);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar21 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar21);
  pfStack_1bd30 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1bd18);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1bd30 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1bc68[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1bd30 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1bd30 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_1bd30 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar17,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1bd30 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1c0a8 = (code *)0x119494;
  ppfStack_1bd48 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1bd40 = ppfVar20;
  ppfStack_1bd38 = ppfVar8;
  pfStack_1bd30 = pfVar9;
  gettimeofday(&tStack_1c058,(__timezone_ptr_t)0x0);
  pcStack_1c0a8 = (code *)0x119499;
  memleak_start();
  pcStack_1c0a8 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_1c048;
  pcStack_1c0a8 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1c0a8 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1c0a8 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1c088,"./dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1c0a8 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1c088,&pfStack_1c080,"db",&fStack_1c070);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1c0a8 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1c088,&pfStack_1c078,"db2",&fStack_1c070);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar12 = &fStack_1be50;
    pcStack_1c0a8 = (code *)0x119539;
    sprintf((char *)pfVar12,"key%d",0);
    ppfVar8 = apfStack_1bf50;
    pcStack_1c0a8 = (code *)0x119554;
    sprintf((char *)ppfVar8,"body%d",0);
    pcStack_1c0a8 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pcStack_1c0a8 = (code *)0x119567;
    sVar5 = strlen((char *)ppfVar8);
    ppfVar20 = &pfStack_1c090;
    pcStack_1c0a8 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar20,pfVar12,(size_t)pfVar9,(void *)0x0,0,ppfVar8,sVar5 + 1);
    pcStack_1c0a8 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1c080,(fdb_doc *)pfStack_1c090);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1c0a8 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1c088,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1c0a8 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1c090->field_6).seqtree,"bOdy%d",0);
    pcStack_1c0a8 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1c078,(fdb_doc *)pfStack_1c090);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1c0a8 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1c088,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1c0a8 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1c080,(fdb_doc *)pfStack_1c090);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1c0a8 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1c078,(fdb_doc *)pfStack_1c090);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1c0a8 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1c080,(fdb_doc *)pfStack_1c090);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1c0a8 = (code *)0x11964d;
      fdb_close(pfStack_1c088);
      pcStack_1c0a8 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1c090);
      pcStack_1c0a8 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1c0a8 = (code *)0x119661;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_1c0a8 = (code *)0x119692;
      fprintf(_stderr,pcVar17,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1c0a8 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1c0a8 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1c0a8 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1c0a8 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1c0a8 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1c0a8 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1c0a8 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1c0a8 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1c0a8 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1c0a8 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1c0d0 = pfVar12;
  ppfStack_1c0c8 = ppfVar20;
  pfStack_1c0c0 = (fdb_kvs_handle *)pcVar17;
  ppfStack_1c0b8 = ppfVar8;
  pfStack_1c0b0 = pfVar9;
  pcStack_1c0a8 = (code *)uVar18;
  gettimeofday(&tStack_1c4e0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1c4d0.wal_threshold = 0x400;
  fStack_1c4d0.flags = 1;
  fStack_1c4d0.purging_interval = 0;
  fStack_1c4d0.compaction_threshold = '\0';
  fStack_1c4d0.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1c4d0.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1c538,"./dummy1",&fStack_1c4d0);
  fdb_kvs_open_default(pfStack_1c538,&pfStack_1c540,&fStack_1c4f8);
  fVar3 = fdb_set_log_callback(pfStack_1c540,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1c540,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar18 = 0;
    do {
      sprintf(acStack_1c2d8,"key%d",uVar18);
      sprintf(acStack_1c1d8,"body%d",uVar18);
      pfVar9 = pfStack_1c540;
      sVar5 = strlen(acStack_1c2d8);
      sVar6 = strlen(acStack_1c1d8);
      fVar3 = fdb_set_kv(pfVar9,acStack_1c2d8,sVar5,acStack_1c1d8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar10 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar10;
    } while (uVar10 != 10);
    asStack_1c528[1] = 0x726162ffffffff;
    asStack_1c528[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1c510 = 0xbdbdbdbd;
    uStack_1c50c = 0xbdbdbdbd;
    uStack_1c508 = 0xbdbdbdbd;
    uStack_1c504 = 0xbdbdbdbd;
    uStack_1c500 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1c538,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1c540);
    fdb_close(pfStack_1c538);
    fStack_1c4d0.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1c4d0.encryption_key.bytes,"bar",4);
    fStack_1c4d0.encryption_key.bytes[4] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[5] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[6] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[7] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[8] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[9] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[10] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0xb] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0xc] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0xd] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0xe] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0xf] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x10] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x11] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x12] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x13] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x14] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x15] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x16] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x17] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x18] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x19] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1c4d0.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1c538,"./dummy1",&fStack_1c4d0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1c538,&pfStack_1c540,&fStack_1c4f8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1c540,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar18 = 0;
      while( true ) {
        sprintf(acStack_1c2d8,"key%d",uVar18);
        pfVar9 = pfStack_1c540;
        sVar5 = strlen(acStack_1c2d8);
        fVar3 = fdb_get_kv(pfVar9,acStack_1c2d8,sVar5,&pvStack_1c530,asStack_1c528);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1c3d8,"body%d",uVar18);
        ptr = pvStack_1c530;
        iVar4 = bcmp(pvStack_1c530,acStack_1c3d8,asStack_1c528[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar10 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar10;
        if (uVar10 == 10) {
          fdb_kvs_close(pfStack_1c540);
          fdb_close(pfStack_1c538);
          fdb_shutdown();
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar17,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
LAB_00117e03:
  pfStack_a68 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar14 = pfVar16;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_de0 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar17;
LAB_00118166:
  pcVar17 = (char *)pfVar19;
  pfStack_de0 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_de0 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar17;
LAB_00118178:
  pfVar16 = afStack_c88;
  ppfVar8 = apfStack_d88;
  pfStack_de0 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1bd30 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1bd30 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1bd30 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1bd30 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
}

Assistant:

void flush_before_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn;
    fdb_kvs_handle *db, *db_txn;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 5;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn, &db_txn, &kvs_config);
    status = fdb_set_log_callback(db_txn, logCallbackFunc,
                                  (void *) "flush_before_commit_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // non-transactional commit first, transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // transactional commit first, non-transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (non-txn commit first, txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (txn commit first, non-txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin transaction
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);

    // insert docs using transaction
    for (i=0;i<10;++i){
        fdb_set(db_txn, doc[i]);
    }

    // insert docs without transaction
    for (i=10;i<20;++i){
        fdb_set(db, doc[i]);
    }

    // do compaction
    fdb_compact(dbfile, "dummy2");

    for (i=20;i<25;++i){
        fdb_set(db_txn, doc[i]);
    }
    // end transaction
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);

    for (i=25;i<30;++i){
        fdb_set(db, doc[i]);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit test");
}